

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

Inst * __thiscall mir::inst::PhiInst::deep_copy(PhiInst *this)

{
  uint32_t uVar1;
  Inst *pIVar2;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_30;
  
  pIVar2 = (Inst *)operator_new(0x40);
  uVar1 = (this->super_Inst).dest.id;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_30,&this->vars);
  (pIVar2->dest).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  (pIVar2->dest).id = uVar1;
  (pIVar2->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f03d8;
  pIVar2[1].super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  *(uint32_t *)&pIVar2[1].dest.super_Displayable._vptr_Displayable = uVar1;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&pIVar2[1].dest.id,
             &local_30);
  if (local_30.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pIVar2;
}

Assistant:

Inst* deep_copy() { return new PhiInst(dest, vars); }